

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O1

void asio::detail::executor_function::
     complete<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
               (impl_base *base,bool call)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  allocator<void> allocator;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  function;
  ptr p;
  allocator<void> local_59;
  impl_base local_58;
  _func_void_impl_base_ptr_bool *p_Stack_50;
  _func_void_impl_base_ptr_bool *local_48;
  _func_void_impl_base_ptr_bool *local_40;
  _func_void_impl_base_ptr_bool *local_38;
  _func_void_impl_base_ptr_bool *p_Stack_30;
  ptr local_20;
  
  local_20.a = &local_59;
  local_58.complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  p_Stack_50 = (_func_void_impl_base_ptr_bool *)0x0;
  local_48 = (_func_void_impl_base_ptr_bool *)0x0;
  local_40 = base[4].complete_;
  p_Var1 = base[3].complete_;
  if (p_Var1 != (_func_void_impl_base_ptr_bool *)0x0) {
    local_58.complete_ = base[1].complete_;
    p_Stack_50 = base[2].complete_;
    base[3].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
    base[4].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
    local_48 = p_Var1;
  }
  local_38 = base[5].complete_;
  p_Stack_30 = base[6].complete_;
  local_20.v = base;
  local_20.p = (impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  ::ptr::reset(&local_20);
  if (call) {
    if (local_48 == (_func_void_impl_base_ptr_bool *)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_40)(&local_58,SUB81(&local_38,0));
  }
  if (local_48 != (_func_void_impl_base_ptr_bool *)0x0) {
    (*local_48)(&local_58,SUB81(&local_58,0));
  }
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  ::ptr::reset(&local_20);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }